

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall libtorrent::aux::peer_connection::update_desired_queue_size(peer_connection *this)

{
  uint16_t uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  session_settings *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar6;
  _Atomic_word _Var7;
  uint uVar8;
  undefined4 extraout_var;
  uint uVar9;
  bool bVar10;
  unique_lock<std::mutex> local_38;
  
  if (((this->super_peer_connection_hot_members).field_0x28 & 8) == 0) {
    uVar1 = this->m_desired_queue_size;
    iVar6 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])(this);
    uVar3 = *(uint *)(CONCAT44(extraout_var,iVar6) + 0x2c);
    psVar5 = (this->super_peer_connection_hot_members).m_settings;
    local_38._M_device = &psVar5->m_mutex;
    local_38._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_38);
    local_38._M_owns = true;
    uVar4 = (psVar5->m_store).m_ints._M_elems[6];
    ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
    if ((this->field_0x887 & 0x20) == 0) {
      this_00 = (this->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      _Var7 = this_00->_M_use_count;
      do {
        LOCK();
        iVar6 = this_00->_M_use_count;
        bVar10 = _Var7 == iVar6;
        if (bVar10) {
          this_00->_M_use_count = _Var7 + 1;
          iVar6 = _Var7;
        }
        _Var7 = iVar6;
        UNLOCK();
      } while (!bVar10);
      uVar8 = (((((this->super_peer_connection_hot_members).m_torrent.
                  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files).m_piece_length;
      uVar9 = 0x4000;
      if (uVar8 < 0x4000) {
        uVar9 = uVar8;
      }
      if ((int)uVar8 < 1) {
        uVar9 = 0x4000;
      }
      this->m_desired_queue_size = (uint16_t)((int)(uVar4 * uVar3) / (int)uVar9);
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    uVar8._0_2_ = this->m_desired_queue_size;
    uVar8._2_2_ = this->m_prefer_contiguous_blocks;
    uVar2 = this->m_max_out_request_queue;
    uVar9 = uVar8;
    if (uVar2 <= (ushort)(undefined2)uVar8) {
      uVar9 = (uint)uVar2;
    }
    if (uVar2 < (ushort)(undefined2)uVar8 || (ushort)uVar9 < 2) {
      uVar8 = 2;
      if (2 < (ushort)uVar9) {
        uVar8 = uVar9;
      }
      this->m_desired_queue_size = (uint16_t)uVar8;
    }
    if (uVar1 != (uint16_t)uVar8) {
      peer_log(this,info,"UPDATE_QUEUE_SIZE",
               "dqs: %d max: %d dl: %d qt: %d snubbed: %d slow-start: %d",(ulong)(uVar8 & 0xffff),
               (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
               (ulong)(*(uint *)&(this->super_peer_connection_hot_members).field_0x28 >> 3 & 1),
               (ulong)((byte)this->field_0x887 >> 5 & 1));
    }
  }
  else {
    this->m_desired_queue_size = 1;
  }
  return;
}

Assistant:

void peer_connection::update_desired_queue_size()
	{
		TORRENT_ASSERT(is_single_thread());
		if (m_snubbed)
		{
			m_desired_queue_size = 1;
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		int const previous_queue_size = m_desired_queue_size;
#endif

		int const download_rate = statistics().download_payload_rate();

		// the desired download queue size
		int const queue_time = m_settings.get_int(settings_pack::request_queue_time);

		// when we're in slow-start mode we increase the desired queue size every
		// time we receive a piece, no need to adjust it here (other than
		// enforcing the upper limit)
		if (!m_slow_start)
		{
			// (if the latency is more than this, the download will stall)
			// so, the queue size is queue_time * down_rate / 16 kiB
			// (16 kB is the size of each request)
			// the minimum number of requests is 2 and the maximum is 48
			// the block size doesn't have to be 16. So we first query the
			// torrent for it
			auto t = m_torrent.lock();
			int const bs = t->block_size();

			TORRENT_ASSERT(bs > 0);

			m_desired_queue_size = std::uint16_t(queue_time * download_rate / bs);
		}

		if (m_desired_queue_size > m_max_out_request_queue)
			m_desired_queue_size = m_max_out_request_queue;
		if (m_desired_queue_size < min_request_queue)
			m_desired_queue_size = min_request_queue;

#ifndef TORRENT_DISABLE_LOGGING
		if (previous_queue_size != m_desired_queue_size)
		{
			peer_log(peer_log_alert::info, "UPDATE_QUEUE_SIZE"
				, "dqs: %d max: %d dl: %d qt: %d snubbed: %d slow-start: %d"
				, int(m_desired_queue_size), int(m_max_out_request_queue)
				, download_rate, queue_time, int(m_snubbed), int(m_slow_start));
		}
#endif
	}